

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O2

void Minisat::selectionSort<unsigned_int,reduceDB_lt>(uint *array,int size,reduceDB_lt lt)

{
  ulong *puVar1;
  ulong *puVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  
  iVar8 = 1;
  if (1 < size) {
    iVar8 = size;
  }
  uVar9 = 1;
  for (uVar10 = 0; uVar10 != iVar8 - 1; uVar10 = uVar10 + 1) {
    uVar13 = uVar10 & 0xffffffff;
    for (uVar11 = uVar9; iVar12 = (int)uVar13, (uint)size != uVar11; uVar11 = uVar11 + 1) {
      puVar6 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
      puVar1 = (ulong *)(puVar6 + array[uVar11]);
      puVar2 = (ulong *)(puVar6 + array[iVar12]);
      fVar4 = *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8);
      pfVar3 = (float *)((long)puVar1 + (*puVar1 >> 0x22) * 4 + 8);
      uVar7 = uVar11 & 0xffffffff;
      if (fVar4 < *pfVar3 || fVar4 == *pfVar3) {
        uVar7 = uVar13;
      }
      uVar13 = uVar7;
    }
    uVar5 = array[uVar10];
    array[uVar10] = array[iVar12];
    array[iVar12] = uVar5;
    uVar9 = uVar9 + 1;
  }
  return;
}

Assistant:

void selectionSort(T *array, int size, LessThan lt)
{
    int i, j, best_i;
    T tmp;

    for (i = 0; i < size - 1; i++) {
        best_i = i;
        for (j = i + 1; j < size; j++) {
            if (lt(array[j], array[best_i])) best_i = j;
        }
        tmp = array[i];
        array[i] = array[best_i];
        array[best_i] = tmp;
    }
}